

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

SourceDynamicProfileManager *
Js::SourceDynamicProfileManager::LoadFromDynamicProfileStorage
          (SourceContextInfo *info,ScriptContext *scriptContext,
          SimpleDataCacheWrapper *dataCacheWrapper)

{
  anon_class_8_1_b8cf05bd this;
  bool bVar1;
  Recycler *pRVar2;
  bool profileLoaded;
  TrackAllocData local_60;
  Recycler *local_38;
  anon_class_8_1_b8cf05bd local_30;
  Recycler *recycler;
  SourceDynamicProfileManager *manager;
  SimpleDataCacheWrapper *dataCacheWrapper_local;
  ScriptContext *scriptContext_local;
  SourceContextInfo *info_local;
  
  recycler = (Recycler *)0x0;
  manager = (SourceDynamicProfileManager *)dataCacheWrapper;
  dataCacheWrapper_local = (SimpleDataCacheWrapper *)scriptContext;
  scriptContext_local = (ScriptContext *)info;
  local_30.recycler = ScriptContext::GetRecycler(scriptContext);
  bVar1 = DynamicProfileStorage::IsEnabled();
  if ((bVar1) &&
     ((scriptContext_local->super_ScriptContextBase).pActiveScriptDirect !=
      (IActiveScriptDirect *)0x0)) {
    local_38 = local_30.recycler;
    recycler = (Recycler *)
               DynamicProfileStorage::
               Load<Js::SourceDynamicProfileManager::LoadFromDynamicProfileStorage(SourceContextInfo*,Js::ScriptContext*,Js::SimpleDataCacheWrapper*)::__0>
                         ((char16 *)
                          (scriptContext_local->super_ScriptContextBase).pActiveScriptDirect,
                          local_30);
  }
  this.recycler = local_30.recycler;
  if (recycler == (Recycler *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
               ,0x116);
    pRVar2 = Memory::Recycler::TrackAllocInfo(this.recycler,&local_60);
    pRVar2 = (Recycler *)new<Memory::Recycler>(0x98,pRVar2,0x43c4b0);
    SourceDynamicProfileManager((SourceDynamicProfileManager *)pRVar2,local_30.recycler);
    recycler = pRVar2;
  }
  if (manager != (SourceDynamicProfileManager *)0x0) {
    LoadFromProfileCache
              ((SourceDynamicProfileManager *)recycler,(SimpleDataCacheWrapper *)manager,
               (LPCWSTR)(scriptContext_local->super_ScriptContextBase).pActiveScriptDirect);
  }
  return (SourceDynamicProfileManager *)recycler;
}

Assistant:

SourceDynamicProfileManager *
    SourceDynamicProfileManager::LoadFromDynamicProfileStorage(SourceContextInfo* info, ScriptContext* scriptContext, SimpleDataCacheWrapper* dataCacheWrapper)
    {
        SourceDynamicProfileManager* manager = nullptr;
        Recycler* recycler = scriptContext->GetRecycler();

#ifdef DYNAMIC_PROFILE_STORAGE
        if(DynamicProfileStorage::IsEnabled() && info->url != nullptr)
        {
            manager = DynamicProfileStorage::Load(info->url, [recycler](char const * buffer, uint length) -> SourceDynamicProfileManager *
            {
                BufferReader reader(buffer, length);
                return SourceDynamicProfileManager::Deserialize(&reader, recycler);
            });
        }
#endif
        if(manager == nullptr)
        {
            manager = RecyclerNew(recycler, SourceDynamicProfileManager, recycler);
        }
        if(dataCacheWrapper != nullptr)
        {
            bool profileLoaded = manager->LoadFromProfileCache(dataCacheWrapper, info->url);
            if(profileLoaded)
            {
                JS_ETW(EventWriteJSCRIPT_PROFILE_LOAD(info->dwHostSourceContext, scriptContext));
            }
        }
        return manager;
    }